

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O3

string * __thiscall
skiwi::skiwi_raw_to_string_abi_cxx11_
          (string *__return_storage_ptr__,skiwi *this,uint64_t scm_value,streamsize precision)

{
  stringstream ss;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_1b0;
  stringstream local_1a0 [16];
  long local_190;
  long local_188 [13];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(long *)((long)local_188 + *(long *)(local_190 + -0x18)) = (long)(int)scm_value;
  local_1b0.
  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = DAT_002a8098;
  local_1b0.
  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = DAT_002a80a0;
  if (DAT_002a80a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_002a80a0->_M_use_count = DAT_002a80a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_002a80a0->_M_use_count = DAT_002a80a0->_M_use_count + 1;
    }
  }
  scheme_runtime((uint64_t)this,(ostream *)&local_190,&local_1b0,(repl_data *)&DAT_002a8000,
                 (context *)&DAT_002a7ea8);
  if (local_1b0.
      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.
               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string skiwi_raw_to_string(uint64_t scm_value, std::streamsize precision)
  {
  std::stringstream ss;
  ss << std::setprecision(precision);
  scheme_runtime(scm_value, ss, cd.env, cd.rd, &cd.ctxt);
  return ss.str();
  }